

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_Session * UA_SessionManager_getSession(UA_SessionManager *sm,UA_NodeId *token)

{
  UA_SecureChannel *pUVar1;
  UA_Boolean UVar2;
  ulong uVar3;
  session_list_entry *psVar4;
  UA_Session *pUVar5;
  ulong uVar6;
  undefined1 local_60 [8];
  timespec ts;
  
  psVar4 = (session_list_entry *)sm;
  do {
    psVar4 = ((session_list *)&psVar4->pointers)->lh_first;
    if (psVar4 == (session_list_entry *)0x0) {
      UA_LOG_INFO((sm->server->config).logger,UA_LOGCATEGORY_SESSION,
                  "Try to use Session with token %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x but is not found"
                  ,(ulong)(token->identifier).numeric,(ulong)(token->identifier).guid.data2,
                  (ulong)(token->identifier).guid.data3,(ulong)(token->identifier).guid.data4[0],
                  (ulong)(token->identifier).guid.data4[1],(ulong)(token->identifier).guid.data4[2],
                  (ulong)(token->identifier).guid.data4[3],(ulong)(token->identifier).guid.data4[4],
                  (ulong)(token->identifier).guid.data4[5],(ulong)(token->identifier).guid.data4[6],
                  (ulong)(token->identifier).guid.data4[7]);
      return (UA_Session *)0x0;
    }
    UVar2 = UA_NodeId_equal(&(psVar4->session).authenticationToken,token);
  } while (!UVar2);
  clock_gettime(4,(timespec *)local_60);
  if ((psVar4->session).validTill < ts.tv_sec / 100 + (long)local_60 * 10000000) {
    pUVar1 = (psVar4->session).channel;
    uVar6 = 0;
    uVar3 = 0;
    if ((pUVar1 != (UA_SecureChannel *)0x0) && (pUVar1->connection != (UA_Connection *)0x0)) {
      uVar3 = (ulong)(uint)pUVar1->connection->sockfd;
    }
    if (pUVar1 != (UA_SecureChannel *)0x0) {
      uVar6 = (ulong)(pUVar1->securityToken).channelId;
    }
    ts.tv_nsec = (__syscall_slong_t)(psVar4->session).sessionId.identifier.guid.data4[0];
    pUVar5 = (UA_Session *)0x0;
    UA_LOG_INFO((sm->server->config).logger,UA_LOGCATEGORY_SESSION,
                "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Client tries to use a session that has timed out"
                ,uVar3,uVar6,(ulong)(psVar4->session).sessionId.identifier.guid.data1,
                (ulong)(psVar4->session).sessionId.identifier.guid.data2,
                (ulong)(psVar4->session).sessionId.identifier.guid.data3,ts.tv_nsec,
                (ulong)(psVar4->session).sessionId.identifier.guid.data4[1],
                (ulong)(psVar4->session).sessionId.identifier.guid.data4[2],
                (ulong)(psVar4->session).sessionId.identifier.guid.data4[3],
                (ulong)(psVar4->session).sessionId.identifier.guid.data4[4],
                (ulong)(psVar4->session).sessionId.identifier.guid.data4[5],
                (ulong)(psVar4->session).sessionId.identifier.guid.data4[6],
                (ulong)(psVar4->session).sessionId.identifier.guid.data4[7]);
  }
  else {
    pUVar5 = &psVar4->session;
  }
  return pUVar5;
}

Assistant:

UA_Session *
UA_SessionManager_getSession(UA_SessionManager *sm, const UA_NodeId *token) {
    session_list_entry *current = NULL;
    LIST_FOREACH(current, &sm->sessions, pointers) {
        /* Token does not match */
        if(!UA_NodeId_equal(&current->session.authenticationToken, token))
            continue;

        /* Session has timed out */
        if(UA_DateTime_nowMonotonic() > current->session.validTill) {
            UA_LOG_INFO_SESSION(sm->server->config.logger, &current->session,
                                "Client tries to use a session that has timed out");
            return NULL;
        }

        /* Ok, return */
        return &current->session;
    }

    /* Session not found */
    UA_LOG_INFO(sm->server->config.logger, UA_LOGCATEGORY_SESSION,
                "Try to use Session with token " UA_PRINTF_GUID_FORMAT " but is not found",
                UA_PRINTF_GUID_DATA(token->identifier.guid));
    return NULL;
}